

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3MemRealloc(void *pPrior,int nByte)

{
  long *plVar1;
  sqlite3_int64 *p;
  
  plVar1 = (long *)realloc((uint *)((long)pPrior + -8),(long)(nByte + 8));
  if (plVar1 == (long *)0x0) {
    plVar1 = (long *)0x0;
    sqlite3_log(7,"failed memory resize %u to %u bytes",(ulong)*(uint *)((long)pPrior + -8),nByte);
  }
  else {
    *plVar1 = (long)nByte;
    plVar1 = plVar1 + 1;
  }
  return plVar1;
}

Assistant:

static void *sqlite3MemRealloc(void *pPrior, int nByte){
#ifdef SQLITE_MALLOCSIZE
  void *p = SQLITE_REALLOC(pPrior, nByte);
  if( p==0 ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    sqlite3_log(SQLITE_NOMEM,
      "failed memory resize %u to %u bytes",
      SQLITE_MALLOCSIZE(pPrior), nByte);
  }
  return p;
#else
  sqlite3_int64 *p = (sqlite3_int64*)pPrior;
  assert( pPrior!=0 && nByte>0 );
  assert( nByte==ROUND8(nByte) ); /* EV: R-46199-30249 */
  p--;
  p = SQLITE_REALLOC(p, nByte+8 );
  if( p ){
    p[0] = nByte;
    p++;
  }else{
    testcase( sqlite3GlobalConfig.xLog!=0 );
    sqlite3_log(SQLITE_NOMEM,
      "failed memory resize %u to %u bytes",
      sqlite3MemSize(pPrior), nByte);
  }
  return (void*)p;
#endif
}